

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_block_ptr(Integer g_a,Integer idx,void *ptr,Integer *ld)

{
  short sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  undefined8 *in_RDX;
  long lVar5;
  long in_RSI;
  long in_RDI;
  int _ndim_10;
  int _i_10;
  int _itmp_4;
  Integer indices [7];
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_1;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_3;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_2;
  Integer _nb_2;
  Integer _loc_2;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer index;
  Integer hi [7];
  Integer lo [7];
  Integer ndim;
  Integer inode;
  Integer tsum;
  Integer offset;
  Integer nblocks;
  Integer j;
  Integer i;
  Integer handle;
  char *lptr;
  int local_2f0;
  int local_2ec;
  long local_2e8 [7];
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298 [7];
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  int local_268 [8];
  int local_248;
  int local_244;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8 [7];
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188 [8];
  int local_168;
  int local_164;
  long local_160;
  Integer in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  long local_148;
  long local_140;
  long local_138;
  long local_120;
  long local_110;
  long local_108;
  long local_100;
  C_Integer aCStack_e8 [8];
  C_Integer aCStack_a8 [8];
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  char *local_28;
  long local_20;
  undefined8 *local_18;
  
  local_30 = in_RDI + 1000;
  local_48 = GA[local_30].block_total;
  local_68 = (long)GA[local_30].ndim;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if ((in_RSI < 0) || (GA[local_30].block_total <= in_RSI)) {
    pnga_error(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  local_2ec = (int)in_RSI;
  if (GA[local_30].distr_type == 1) {
    local_50 = 0;
    local_60 = in_RSI % GAnproc;
    for (local_38 = in_RSI % GAnproc; local_38 < in_RSI; local_38 = GAnproc + local_38) {
      if (GA[local_30].distr_type == 0) {
        if (GA[local_30].num_rstrctd == 0) {
          lVar3 = (long)GA[local_30].ndim;
          local_120 = 0;
          local_100 = 1;
          for (local_108 = 0; local_108 < lVar3; local_108 = local_108 + 1) {
            local_100 = GA[local_30].nblock[local_108] * local_100;
          }
          if ((local_100 + -1 < local_38) || (local_38 < 0)) {
            for (local_108 = 0; local_108 < lVar3; local_108 = local_108 + 1) {
              aCStack_a8[local_108] = 0;
              aCStack_e8[local_108] = -1;
            }
          }
          else {
            local_110 = local_38;
            for (local_108 = 0; local_108 < lVar3; local_108 = local_108 + 1) {
              lVar5 = local_110 % (long)GA[local_30].nblock[local_108];
              local_110 = local_110 / (long)GA[local_30].nblock[local_108];
              lVar4 = lVar5 + local_120;
              local_120 = GA[local_30].nblock[local_108] + local_120;
              aCStack_a8[local_108] = GA[local_30].mapc[lVar4];
              if (lVar5 == GA[local_30].nblock[local_108] + -1) {
                aCStack_e8[local_108] = GA[local_30].dims[local_108];
              }
              else {
                aCStack_e8[local_108] = GA[local_30].mapc[lVar4 + 1] + -1;
              }
            }
          }
        }
        else if (local_38 < GA[local_30].num_rstrctd) {
          lVar3 = (long)GA[local_30].ndim;
          lVar4 = 0;
          local_138 = 1;
          for (local_140 = 0; local_140 < lVar3; local_140 = local_140 + 1) {
            local_138 = GA[local_30].nblock[local_140] * local_138;
          }
          if ((local_138 + -1 < local_38) || (local_38 < 0)) {
            for (local_140 = 0; local_140 < lVar3; local_140 = local_140 + 1) {
              aCStack_a8[local_140] = 0;
              aCStack_e8[local_140] = -1;
            }
          }
          else {
            local_148 = local_38;
            for (local_140 = 0; local_140 < lVar3; local_140 = local_140 + 1) {
              lVar5 = local_148 % (long)GA[local_30].nblock[local_140];
              local_148 = local_148 / (long)GA[local_30].nblock[local_140];
              local_160 = lVar5 + lVar4;
              lVar4 = GA[local_30].nblock[local_140] + lVar4;
              aCStack_a8[local_140] = GA[local_30].mapc[local_160];
              if (lVar5 == GA[local_30].nblock[local_140] + -1) {
                aCStack_e8[local_140] = GA[local_30].dims[local_140];
              }
              else {
                aCStack_e8[local_140] = GA[local_30].mapc[local_160 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[local_30].ndim;
          local_168 = (int)sVar1;
          for (local_164 = 0; local_164 < sVar1; local_164 = local_164 + 1) {
            aCStack_a8[local_164] = 0;
            aCStack_e8[local_164] = -1;
          }
        }
      }
      else {
        local_194 = (int)local_38;
        if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
           (GA[local_30].distr_type == 3)) {
          sVar1 = GA[local_30].ndim;
          local_190 = (int)sVar1;
          sVar2 = GA[local_30].ndim;
          local_19c = (int)sVar2;
          local_188[0] = (int)((long)local_194 % GA[local_30].num_blocks[0]);
          for (local_198 = 1; local_198 < sVar2; local_198 = local_198 + 1) {
            local_194 = (int)((long)(local_194 - local_188[local_198 + -1]) /
                             GA[local_30].num_blocks[local_198 + -1]);
            local_188[local_198] = (int)((long)local_194 % GA[local_30].num_blocks[local_198]);
          }
          for (local_18c = 0; local_18c < sVar1; local_18c = local_18c + 1) {
            aCStack_a8[local_18c] =
                 (long)local_188[local_18c] * GA[local_30].block_dims[local_18c] + 1;
            aCStack_e8[local_18c] =
                 (long)(local_188[local_18c] + 1) * GA[local_30].block_dims[local_18c];
            if (GA[local_30].dims[local_18c] < aCStack_e8[local_18c]) {
              aCStack_e8[local_18c] = GA[local_30].dims[local_18c];
            }
          }
        }
        else if (GA[local_30].distr_type == 4) {
          sVar1 = GA[local_30].ndim;
          local_1c0 = (int)sVar1;
          local_1c4 = 0;
          sVar2 = GA[local_30].ndim;
          local_1d0 = (int)sVar2;
          local_1c8 = local_194;
          local_1b8[0] = (int)((long)local_194 % GA[local_30].num_blocks[0]);
          for (local_1cc = 1; local_1cc < sVar2; local_1cc = local_1cc + 1) {
            local_1c8 = (int)((long)(local_1c8 - local_1b8[local_1cc + -1]) /
                             GA[local_30].num_blocks[local_1cc + -1]);
            local_1b8[local_1cc] = (int)((long)local_1c8 % GA[local_30].num_blocks[local_1cc]);
          }
          for (local_1bc = 0; local_1bc < sVar1; local_1bc = local_1bc + 1) {
            aCStack_a8[local_1bc] = GA[local_30].mapc[local_1c4 + local_1b8[local_1bc]];
            if ((long)local_1b8[local_1bc] < GA[local_30].num_blocks[local_1bc] + -1) {
              aCStack_e8[local_1bc] = GA[local_30].mapc[local_1c4 + local_1b8[local_1bc] + 1] + -1;
            }
            else {
              aCStack_e8[local_1bc] = GA[local_30].dims[local_1bc];
            }
            local_1c4 = local_1c4 + (int)GA[local_30].num_blocks[local_1bc];
          }
        }
      }
      local_58 = 1;
      for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
        local_58 = ((aCStack_e8[local_40] - aCStack_a8[local_40]) + 1) * local_58;
      }
      local_50 = local_58 + local_50;
    }
    local_28 = GA[local_30].ptr[local_60] + local_50 * GA[local_30].elemsize;
    if (GA[local_30].distr_type == 0) {
      if (GA[local_30].num_rstrctd == 0) {
        local_1f8 = (long)GA[local_30].ndim;
        local_200 = 0;
        local_1e0 = 1;
        for (local_1e8 = 0; local_1e8 < local_1f8; local_1e8 = local_1e8 + 1) {
          local_1e0 = GA[local_30].nblock[local_1e8] * local_1e0;
        }
        if ((local_1e0 + -1 < in_RSI) || (in_RSI < 0)) {
          for (local_1e8 = 0; local_1e8 < local_1f8; local_1e8 = local_1e8 + 1) {
            aCStack_a8[local_1e8] = 0;
            aCStack_e8[local_1e8] = -1;
          }
        }
        else {
          local_1f0 = in_RSI;
          for (local_1e8 = 0; local_1e8 < local_1f8; local_1e8 = local_1e8 + 1) {
            local_1d8 = local_1f0 % (long)GA[local_30].nblock[local_1e8];
            local_1f0 = local_1f0 / (long)GA[local_30].nblock[local_1e8];
            local_208 = local_1d8 + local_200;
            local_200 = GA[local_30].nblock[local_1e8] + local_200;
            aCStack_a8[local_1e8] = GA[local_30].mapc[local_208];
            if (local_1d8 == GA[local_30].nblock[local_1e8] + -1) {
              aCStack_e8[local_1e8] = GA[local_30].dims[local_1e8];
            }
            else {
              aCStack_e8[local_1e8] = GA[local_30].mapc[local_208 + 1] + -1;
            }
          }
        }
      }
      else if (in_RSI < GA[local_30].num_rstrctd) {
        local_230 = (long)GA[local_30].ndim;
        local_238 = 0;
        local_218 = 1;
        for (local_220 = 0; local_220 < local_230; local_220 = local_220 + 1) {
          local_218 = GA[local_30].nblock[local_220] * local_218;
        }
        if ((local_218 + -1 < in_RSI) || (in_RSI < 0)) {
          for (local_220 = 0; local_220 < local_230; local_220 = local_220 + 1) {
            aCStack_a8[local_220] = 0;
            aCStack_e8[local_220] = -1;
          }
        }
        else {
          local_228 = in_RSI;
          for (local_220 = 0; local_220 < local_230; local_220 = local_220 + 1) {
            local_210 = local_228 % (long)GA[local_30].nblock[local_220];
            local_228 = local_228 / (long)GA[local_30].nblock[local_220];
            local_240 = local_210 + local_238;
            local_238 = GA[local_30].nblock[local_220] + local_238;
            aCStack_a8[local_220] = GA[local_30].mapc[local_240];
            if (local_210 == GA[local_30].nblock[local_220] + -1) {
              aCStack_e8[local_220] = GA[local_30].dims[local_220];
            }
            else {
              aCStack_e8[local_220] = GA[local_30].mapc[local_240 + 1] + -1;
            }
          }
        }
      }
      else {
        sVar1 = GA[local_30].ndim;
        local_248 = (int)sVar1;
        for (local_244 = 0; local_244 < sVar1; local_244 = local_244 + 1) {
          aCStack_a8[local_244] = 0;
          aCStack_e8[local_244] = -1;
        }
      }
    }
    else if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
            (GA[local_30].distr_type == 3)) {
      sVar1 = GA[local_30].ndim;
      local_270 = (int)sVar1;
      sVar2 = GA[local_30].ndim;
      local_27c = (int)sVar2;
      local_274 = local_2ec;
      local_268[0] = (int)((long)local_2ec % GA[local_30].num_blocks[0]);
      for (local_278 = 1; local_278 < sVar2; local_278 = local_278 + 1) {
        local_274 = (int)((long)(local_274 - local_268[local_278 + -1]) /
                         GA[local_30].num_blocks[local_278 + -1]);
        local_268[local_278] = (int)((long)local_274 % GA[local_30].num_blocks[local_278]);
      }
      for (local_26c = 0; local_26c < sVar1; local_26c = local_26c + 1) {
        aCStack_a8[local_26c] = (long)local_268[local_26c] * GA[local_30].block_dims[local_26c] + 1;
        aCStack_e8[local_26c] =
             (long)(local_268[local_26c] + 1) * GA[local_30].block_dims[local_26c];
        if (GA[local_30].dims[local_26c] < aCStack_e8[local_26c]) {
          aCStack_e8[local_26c] = GA[local_30].dims[local_26c];
        }
      }
    }
    else if (GA[local_30].distr_type == 4) {
      sVar1 = GA[local_30].ndim;
      local_2a0 = (int)sVar1;
      local_2a4 = 0;
      sVar2 = GA[local_30].ndim;
      local_2b0 = (int)sVar2;
      local_2a8 = local_2ec;
      local_298[0] = (int)((long)local_2ec % GA[local_30].num_blocks[0]);
      for (local_2ac = 1; local_2ac < sVar2; local_2ac = local_2ac + 1) {
        local_2a8 = (int)((long)(local_2a8 - local_298[local_2ac + -1]) /
                         GA[local_30].num_blocks[local_2ac + -1]);
        local_298[local_2ac] = (int)((long)local_2a8 % GA[local_30].num_blocks[local_2ac]);
      }
      for (local_29c = 0; local_29c < sVar1; local_29c = local_29c + 1) {
        aCStack_a8[local_29c] = GA[local_30].mapc[local_2a4 + local_298[local_29c]];
        if ((long)local_298[local_29c] < GA[local_30].num_blocks[local_29c] + -1) {
          aCStack_e8[local_29c] = GA[local_30].mapc[local_2a4 + local_298[local_29c] + 1] + -1;
        }
        else {
          aCStack_e8[local_29c] = GA[local_30].dims[local_29c];
        }
        local_2a4 = local_2a4 + (int)GA[local_30].num_blocks[local_29c];
      }
    }
    for (local_38 = 0; local_38 < local_68 + -1; local_38 = local_38 + 1) {
      *(C_Integer *)(local_20 + local_38 * 8) = (aCStack_e8[local_38] - aCStack_a8[local_38]) + 1;
    }
  }
  else if (((GA[local_30].distr_type == 2) || (GA[local_30].distr_type == 3)) ||
          (GA[local_30].distr_type == 4)) {
    sVar1 = GA[local_30].ndim;
    local_2e8[0] = (long)local_2ec % GA[local_30].num_blocks[0];
    for (local_2f0 = 1; local_2f0 < sVar1; local_2f0 = local_2f0 + 1) {
      local_2ec = (int)(((long)local_2ec - local_2e8[local_2f0 + -1]) /
                       GA[local_30].num_blocks[local_2f0 + -1]);
      local_2e8[local_2f0] = (long)local_2ec % GA[local_30].num_blocks[local_2f0];
    }
    pnga_access_block_grid_ptr
              (_index_2._16_8_,(Integer *)_index_2._8_8_,(void *)_index_2._0_8_,__ndim_1);
  }
  *local_18 = local_28;
  return;
}

Assistant:

void pnga_access_block_ptr(Integer g_a, Integer idx, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * idx: block index  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i, j/*, p_handle*/, nblocks, offset, tsum, inode;
  Integer ndim, lo[MAXDIM], hi[MAXDIM], index;

  
  /*p_handle = GA[handle].p_handle;*/
  nblocks = GA[handle].block_total;
  ndim = GA[handle].ndim;
  index = idx;
  if (index < 0 || index >= nblocks)
    pnga_error("block index outside allowed values",index);

  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    offset = 0;
    inode = index%GAnproc;
    for (i=inode; i<index; i += GAnproc) {
      ga_ownsM(handle,i,lo,hi); 
      tsum = 1;
      for (j=0; j<ndim; j++) {
        tsum *= (hi[j]-lo[j]+1);
      }
      offset += tsum;
    }
    lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

    ga_ownsM(handle,index,lo,hi); 
    for (i=0; i<ndim-1; i++) {
      ld[i] = hi[i]-lo[i]+1;
    }
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG) {
    Integer indices[MAXDIM];
    /* find block indices */
    gam_find_block_indices(handle,index,indices);
    /* find pointer */
    pnga_access_block_grid_ptr(g_a, indices, &lptr, ld);
  }
  *(char**)ptr = lptr; 

}